

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O1

int __thiscall ncnn::InnerProduct::load_model(InnerProduct *this,ModelBin *mb)

{
  Mat *pMVar1;
  Mat *pMVar2;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  size_t sVar6;
  Layer *pLVar7;
  Option *pOVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  Mat int8_weight_data;
  ParamDict pd;
  void *local_588;
  int *piStack_580;
  size_t local_578;
  Allocator *pAStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  size_t local_558;
  undefined1 local_548 [8];
  int *piStack_540;
  size_t local_538;
  Allocator *local_530;
  int local_528;
  int iStack_524;
  int iStack_520;
  int iStack_51c;
  Allocator *local_518 [157];
  
  (**mb->_vptr_ModelBin)(local_548,mb,(ulong)(uint)this->weight_data_size,0);
  pMVar1 = &this->weight_data;
  if (pMVar1 != (Mat *)local_548) {
    if (piStack_540 != (int *)0x0) {
      LOCK();
      *piStack_540 = *piStack_540 + 1;
      UNLOCK();
    }
    piVar3 = (this->weight_data).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->weight_data).data;
        pAVar5 = (this->weight_data).allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(*(void **)((long)pvVar4 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar5 + 8))();
        }
      }
    }
    pMVar1->data = (void *)0x0;
    (this->weight_data).refcount = (int *)0x0;
    (this->weight_data).elemsize = 0;
    (this->weight_data).cstep = 0;
    (this->weight_data).dims = 0;
    (this->weight_data).w = 0;
    (this->weight_data).h = 0;
    (this->weight_data).c = 0;
    (this->weight_data).data = (void *)local_548;
    (this->weight_data).refcount = piStack_540;
    (this->weight_data).elemsize = local_538;
    (this->weight_data).allocator = local_530;
    (this->weight_data).dims = local_528;
    (this->weight_data).w = iStack_524;
    (this->weight_data).h = iStack_520;
    (this->weight_data).c = iStack_51c;
    (this->weight_data).cstep = (size_t)local_518[0];
  }
  if (piStack_540 != (int *)0x0) {
    LOCK();
    *piStack_540 = *piStack_540 + -1;
    UNLOCK();
    if (*piStack_540 == 0) {
      if (local_530 == (Allocator *)0x0) {
        if (local_548 != (undefined1  [8])0x0) {
          free(*(void **)((long)local_548 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_530 + 8))();
      }
    }
  }
  iVar9 = -100;
  if ((pMVar1->data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (**mb->_vptr_ModelBin)(local_548,mb,(ulong)(uint)this->num_output,1);
      pMVar2 = &this->bias_data;
      if (pMVar2 != (Mat *)local_548) {
        if (piStack_540 != (int *)0x0) {
          LOCK();
          *piStack_540 = *piStack_540 + 1;
          UNLOCK();
        }
        piVar3 = (this->bias_data).refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar4 = (this->bias_data).data;
            pAVar5 = (this->bias_data).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(*(void **)((long)pvVar4 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar5 + 8))();
            }
          }
        }
        pMVar2->data = (void *)0x0;
        (this->bias_data).refcount = (int *)0x0;
        (this->bias_data).elemsize = 0;
        (this->bias_data).cstep = 0;
        (this->bias_data).dims = 0;
        (this->bias_data).w = 0;
        (this->bias_data).h = 0;
        (this->bias_data).c = 0;
        (this->bias_data).data = (void *)local_548;
        (this->bias_data).refcount = piStack_540;
        (this->bias_data).elemsize = local_538;
        (this->bias_data).allocator = local_530;
        (this->bias_data).dims = local_528;
        (this->bias_data).w = iStack_524;
        (this->bias_data).h = iStack_520;
        (this->bias_data).c = iStack_51c;
        (this->bias_data).cstep = (size_t)local_518[0];
      }
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + -1;
        UNLOCK();
        if (*piStack_540 == 0) {
          if (local_530 == (Allocator *)0x0) {
            if (local_548 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_548 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_530 + 8))();
          }
        }
      }
      if (pMVar2->data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    if (this->int8_scale_term != 0) {
      (**mb->_vptr_ModelBin)(local_548,mb,1,1);
      this->weight_data_int8_scale = *(float *)local_548;
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + -1;
        UNLOCK();
        if (*piStack_540 == 0) {
          if (local_530 == (Allocator *)0x0) {
            if (local_548 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_548 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_530 + 8))();
          }
        }
      }
      (**mb->_vptr_ModelBin)(local_548,mb,1,1);
      this->bottom_blob_int8_scale = *(float *)local_548;
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + -1;
        UNLOCK();
        if (*piStack_540 == 0) {
          if (local_530 == (Allocator *)0x0) {
            if (local_548 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_548 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_530 + 8))();
          }
        }
      }
    }
    sVar6 = (this->weight_data).elemsize;
    if ((sVar6 == 1) && (this->use_int8_inference == false)) {
      load_model();
      iVar9 = -1;
    }
    else {
      if (this->use_int8_inference == true) {
        pLVar7 = create_layer(0x39);
        this->quantize = pLVar7;
        pLVar7 = create_layer(0x3a);
        this->dequantize = pLVar7;
      }
      if ((sVar6 == 4) && (this->use_int8_inference == true)) {
        if ((this->weight_data_int8_scale == 0.0) || (this->bottom_blob_int8_scale == 0.0)) {
          this->use_int8_inference = false;
        }
        else {
          ParamDict::ParamDict((ParamDict *)local_548);
          ParamDict::set((ParamDict *)local_548,0,this->weight_data_int8_scale);
          (*this->quantize->_vptr_Layer[2])(this->quantize,local_548);
          local_568 = 0;
          uStack_560 = 0;
          local_578 = 0;
          pAStack_570 = (Allocator *)0x0;
          local_588 = (void *)0x0;
          piStack_580 = (int *)0x0;
          local_558 = 0;
          pLVar7 = this->quantize;
          pOVar8 = get_default_option();
          (*pLVar7->_vptr_Layer[5])(pLVar7,pMVar1,&local_588,pOVar8);
          if (local_588 == (void *)0x0) {
            bVar11 = true;
          }
          else {
            bVar11 = (long)uStack_560._4_4_ * local_558 == 0;
          }
          if (bVar11) {
            if (piStack_580 != (int *)0x0) {
              LOCK();
              *piStack_580 = *piStack_580 + -1;
              UNLOCK();
              if (*piStack_580 == 0) {
                if (pAStack_570 == (Allocator *)0x0) {
                  if (local_588 != (void *)0x0) {
                    free(*(void **)((long)local_588 + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)pAStack_570 + 8))();
                }
              }
            }
            lVar10 = 0x4d8;
            do {
              piVar3 = *(int **)((long)&piStack_540 + lVar10);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (*(long **)((long)&local_530 + lVar10) == (long *)0x0) {
                    if (*(long *)(local_548 + lVar10) != 0) {
                      free(*(void **)(*(long *)(local_548 + lVar10) + -8));
                    }
                  }
                  else {
                    (**(code **)(**(long **)((long)&local_530 + lVar10) + 8))();
                  }
                }
              }
              *(undefined8 *)(local_548 + lVar10) = 0;
              *(undefined8 *)((long)&piStack_540 + lVar10) = 0;
              *(undefined8 *)((long)&local_538 + lVar10) = 0;
              *(undefined8 *)((long)local_518 + lVar10) = 0;
              *(undefined8 *)((long)&local_528 + lVar10) = 0;
              *(undefined8 *)((long)&iStack_520 + lVar10) = 0;
              lVar10 = lVar10 + -0x40;
            } while (lVar10 != -0x28);
            return -100;
          }
          if (pMVar1 != (Mat *)&local_588) {
            if (piStack_580 != (int *)0x0) {
              LOCK();
              *piStack_580 = *piStack_580 + 1;
              UNLOCK();
            }
            piVar3 = (this->weight_data).refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                pvVar4 = (this->weight_data).data;
                pAVar5 = (this->weight_data).allocator;
                if (pAVar5 == (Allocator *)0x0) {
                  if (pvVar4 != (void *)0x0) {
                    free(*(void **)((long)pvVar4 + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)pAVar5 + 8))();
                }
              }
            }
            pMVar1->data = (void *)0x0;
            (this->weight_data).refcount = (int *)0x0;
            (this->weight_data).elemsize = 0;
            (this->weight_data).cstep = 0;
            (this->weight_data).dims = 0;
            (this->weight_data).w = 0;
            (this->weight_data).h = 0;
            (this->weight_data).c = 0;
            (this->weight_data).data = local_588;
            (this->weight_data).refcount = piStack_580;
            (this->weight_data).elemsize = local_578;
            (this->weight_data).allocator = pAStack_570;
            (this->weight_data).dims = (int)local_568;
            (this->weight_data).w = local_568._4_4_;
            (this->weight_data).h = (int)uStack_560;
            (this->weight_data).c = uStack_560._4_4_;
            (this->weight_data).cstep = local_558;
          }
          if (piStack_580 != (int *)0x0) {
            LOCK();
            *piStack_580 = *piStack_580 + -1;
            UNLOCK();
            if (*piStack_580 == 0) {
              if (pAStack_570 == (Allocator *)0x0) {
                if (local_588 != (void *)0x0) {
                  free(*(void **)((long)local_588 + -8));
                }
              }
              else {
                (**(code **)(*(long *)pAStack_570 + 8))();
              }
            }
          }
          lVar10 = 0x4d8;
          do {
            piVar3 = *(int **)((long)&piStack_540 + lVar10);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (*(long **)((long)&local_530 + lVar10) == (long *)0x0) {
                  if (*(long *)(local_548 + lVar10) != 0) {
                    free(*(void **)(*(long *)(local_548 + lVar10) + -8));
                  }
                }
                else {
                  (**(code **)(**(long **)((long)&local_530 + lVar10) + 8))();
                }
              }
            }
            *(undefined8 *)(local_548 + lVar10) = 0;
            *(undefined8 *)((long)&piStack_540 + lVar10) = 0;
            *(undefined8 *)((long)&local_538 + lVar10) = 0;
            *(undefined8 *)((long)local_518 + lVar10) = 0;
            *(undefined8 *)((long)&local_528 + lVar10) = 0;
            *(undefined8 *)((long)&iStack_520 + lVar10) = 0;
            lVar10 = lVar10 + -0x40;
          } while (lVar10 != -0x28);
        }
      }
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int InnerProduct::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term)
    {
        weight_data_int8_scale = mb.load(1, 1)[0];
        bottom_blob_int8_scale = mb.load(1, 1)[0];
    }

    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        dequantize = ncnn::create_layer(ncnn::LayerType::Dequantize);
    }

    if (weight_data_is_float32 && use_int8_inference)
    {
        if (weight_data_int8_scale != 0.f && bottom_blob_int8_scale != 0.f)
        {
            // quantize weight to int8
            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scale);// scale

            quantize->load_param(pd);

            Mat int8_weight_data;
            quantize->forward(weight_data, int8_weight_data);

            if (int8_weight_data.empty())
                return -100;

            weight_data = int8_weight_data;
        }
        else
        {
            // plain float32 weight, fallback to float32 inference
            use_int8_inference = false;
        }
    }

    return 0;
}